

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

bool __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,CommandLineArgumentsCallbackStructure *cs,char *value)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_49;
  undefined1 local_48 [8];
  string var;
  char *value_local;
  CommandLineArgumentsCallbackStructure *cs_local;
  CommandLineArguments *this_local;
  
  var.field_2._8_8_ = value;
  if ((cs->Callback != (CallbackType)0x0) &&
     (iVar2 = (*cs->Callback)(cs->Argument,value,cs->CallData), iVar2 == 0)) {
    this->Internals->LastArgument = this->Internals->LastArgument - 1;
    this_local._7_1_ = 0;
    goto LAB_00838e5c;
  }
  if (cs->Variable != (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_48,"1",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (var.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=((string *)local_48,(char *)var.field_2._8_8_);
    }
    switch(cs->VariableType) {
    case 1:
      PopulateVariable(this,(int *)cs->Variable,(string *)local_48);
      break;
    case 2:
      PopulateVariable(this,(bool *)cs->Variable,(string *)local_48);
      break;
    case 3:
      PopulateVariable(this,(double *)cs->Variable,(string *)local_48);
      break;
    case 4:
      PopulateVariable(this,(char **)cs->Variable,(string *)local_48);
      break;
    case 5:
      PopulateVariable(this,(string *)cs->Variable,(string *)local_48);
      break;
    case 6:
      PopulateVariable(this,(vector<int,_std::allocator<int>_> *)cs->Variable,(string *)local_48);
      break;
    case 7:
      PopulateVariable(this,(vector<bool,_std::allocator<bool>_> *)cs->Variable,(string *)local_48);
      break;
    case 8:
      PopulateVariable(this,(vector<double,_std::allocator<double>_> *)cs->Variable,
                       (string *)local_48);
      break;
    case 9:
      PopulateVariable(this,(vector<char_*,_std::allocator<char_*>_> *)cs->Variable,
                       (string *)local_48);
      break;
    case 10:
      PopulateVariable(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)cs->Variable,(string *)local_48);
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Got unknown variable type: \"");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,cs->VariableType);
      poVar3 = std::operator<<(poVar3,"\"");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this->Internals->LastArgument = this->Internals->LastArgument - 1;
      this_local._7_1_ = 0;
      bVar1 = true;
      goto LAB_00838e42;
    }
    bVar1 = false;
LAB_00838e42:
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) goto LAB_00838e5c;
  }
  this_local._7_1_ = 1;
LAB_00838e5c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineArguments::PopulateVariable(CommandLineArgumentsCallbackStructure* cs,
  const char* value)
{
  // Call the callback
  if ( cs->Callback )
    {
    if ( !cs->Callback(cs->Argument, value, cs->CallData) )
      {
      this->Internals->LastArgument --;
      return 0;
      }
    }
  CommandLineArguments_DEBUG("Set argument: " << cs->Argument << " to " << value);
  if ( cs->Variable )
    {
    std::string var = "1";
    if ( value )
      {
      var = value;
      }
    switch ( cs->VariableType )
      {
    case CommandLineArguments::INT_TYPE:
      this->PopulateVariable(static_cast<int*>(cs->Variable), var);
      break;
    case CommandLineArguments::DOUBLE_TYPE:
      this->PopulateVariable(static_cast<double*>(cs->Variable), var);
      break;
    case CommandLineArguments::STRING_TYPE:
      this->PopulateVariable(static_cast<char**>(cs->Variable), var);
      break;
    case CommandLineArguments::STL_STRING_TYPE:
      this->PopulateVariable(static_cast<std::string*>(cs->Variable), var);
      break;
    case CommandLineArguments::BOOL_TYPE:
      this->PopulateVariable(static_cast<bool*>(cs->Variable), var);
      break;
    case CommandLineArguments::VECTOR_BOOL_TYPE:
      this->PopulateVariable(static_cast<std::vector<bool>*>(cs->Variable), var);
      break;
    case CommandLineArguments::VECTOR_INT_TYPE:
      this->PopulateVariable(static_cast<std::vector<int>*>(cs->Variable), var);
      break;
    case CommandLineArguments::VECTOR_DOUBLE_TYPE:
      this->PopulateVariable(static_cast<std::vector<double>*>(cs->Variable), var);
      break;
    case CommandLineArguments::VECTOR_STRING_TYPE:
      this->PopulateVariable(static_cast<std::vector<char*>*>(cs->Variable), var);
      break;
    case CommandLineArguments::VECTOR_STL_STRING_TYPE:
      this->PopulateVariable(static_cast<std::vector<std::string>*>(cs->Variable), var);
      break;
    default:
      std::cerr << "Got unknown variable type: \"" << cs->VariableType << "\"" << std::endl;
      this->Internals->LastArgument --;
      return 0;
      }
    }
  return 1;
}